

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O3

Branch * __thiscall
CFG::Relooper::AddBranch(Relooper *this,Expression *ConditionInit,Expression *CodeInit)

{
  _Head_base<0UL,_CFG::Branch_*,_false> this_00;
  __uniq_ptr_impl<CFG::Branch,_std::default_delete<CFG::Branch>_> local_30;
  
  this_00._M_head_impl = (Branch *)operator_new(0x28);
  Branch::Branch(this_00._M_head_impl,ConditionInit,CodeInit);
  local_30._M_t.super__Tuple_impl<0UL,_CFG::Branch_*,_std::default_delete<CFG::Branch>_>.
  super__Head_base<0UL,_CFG::Branch_*,_false>._M_head_impl =
       (tuple<CFG::Branch_*,_std::default_delete<CFG::Branch>_>)
       (tuple<CFG::Branch_*,_std::default_delete<CFG::Branch>_>)this_00._M_head_impl;
  std::
  deque<std::unique_ptr<CFG::Branch,std::default_delete<CFG::Branch>>,std::allocator<std::unique_ptr<CFG::Branch,std::default_delete<CFG::Branch>>>>
  ::emplace_back<std::unique_ptr<CFG::Branch,std::default_delete<CFG::Branch>>>
            ((deque<std::unique_ptr<CFG::Branch,std::default_delete<CFG::Branch>>,std::allocator<std::unique_ptr<CFG::Branch,std::default_delete<CFG::Branch>>>>
              *)&this->Branches,
             (unique_ptr<CFG::Branch,_std::default_delete<CFG::Branch>_> *)&local_30);
  if ((_Tuple_impl<0UL,_CFG::Branch_*,_std::default_delete<CFG::Branch>_>)
      local_30._M_t.super__Tuple_impl<0UL,_CFG::Branch_*,_std::default_delete<CFG::Branch>_>.
      super__Head_base<0UL,_CFG::Branch_*,_false>._M_head_impl != (Branch *)0x0) {
    std::default_delete<CFG::Branch>::operator()
              ((default_delete<CFG::Branch> *)&local_30,
               (Branch *)
               local_30._M_t.
               super__Tuple_impl<0UL,_CFG::Branch_*,_std::default_delete<CFG::Branch>_>.
               super__Head_base<0UL,_CFG::Branch_*,_false>._M_head_impl);
  }
  return (_Head_base<0UL,_CFG::Branch_*,_false>)this_00._M_head_impl;
}

Assistant:

Branch* Relooper::AddBranch(wasm::Expression* ConditionInit,
                            wasm::Expression* CodeInit) {
  auto branch = std::make_unique<Branch>(ConditionInit, CodeInit);
  auto* branchPtr = branch.get();
  Branches.push_back(std::move(branch));
  return branchPtr;
}